

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

void open_file(string *filename,ifstream *file_stream)

{
  runtime_error *this;
  string err_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::ifstream::open((string *)file_stream,(_Ios_Openmode)filename);
  if (((byte)file_stream[*(long *)(*(long *)file_stream + -0x18) + 0x20] & 5) == 0) {
    return;
  }
  std::operator+(&bStack_38,"couldn\'t open file ",filename);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)&bStack_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void open_file(const std::string filename, std::ifstream& file_stream) {
	file_stream.open(filename);
	if (file_stream.fail()) {
		std::string err_msg = "couldn't open file " + filename;
		throw std::runtime_error(err_msg);
	}
}